

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_NonDealerWinByDiscard_Test::TEST_ScoringTableTest_NonDealerWinByDiscard_Test
          (TEST_ScoringTableTest_NonDealerWinByDiscard_Test *this)

{
  TEST_ScoringTableTest_NonDealerWinByDiscard_Test *this_local;
  
  memset(this,0,9);
  TEST_GROUP_CppUTestGroupScoringTableTest::TEST_GROUP_CppUTestGroupScoringTableTest
            (&this->super_TEST_GROUP_CppUTestGroupScoringTableTest);
  (this->super_TEST_GROUP_CppUTestGroupScoringTableTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_ScoringTableTest_NonDealerWinByDiscard_Test_0025a490;
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerWinByDiscard)
{
	CHECK_EQUAL(1000, t.nonDealerWinByDiscard(1, 30));
	CHECK_EQUAL(1300, t.nonDealerWinByDiscard(1, 40));
	CHECK_EQUAL(1600, t.nonDealerWinByDiscard(1, 50));
	CHECK_EQUAL(2000, t.nonDealerWinByDiscard(1, 60));
	CHECK_EQUAL(2300, t.nonDealerWinByDiscard(1, 70));

	CHECK_EQUAL(1300, t.nonDealerWinByDiscard(2, 20));
	CHECK_EQUAL(2000, t.nonDealerWinByDiscard(2, 30));
	CHECK_EQUAL(2600, t.nonDealerWinByDiscard(2, 40));
	CHECK_EQUAL(3200, t.nonDealerWinByDiscard(2, 50));
	CHECK_EQUAL(3900, t.nonDealerWinByDiscard(2, 60));
	CHECK_EQUAL(4500, t.nonDealerWinByDiscard(2, 70));

	CHECK_EQUAL(2600, t.nonDealerWinByDiscard(3, 20));
	CHECK_EQUAL(3900, t.nonDealerWinByDiscard(3, 30));
	CHECK_EQUAL(5200, t.nonDealerWinByDiscard(3, 40));
	CHECK_EQUAL(6400, t.nonDealerWinByDiscard(3, 50));
	CHECK_EQUAL(7700, t.nonDealerWinByDiscard(3, 60));

	CHECK_EQUAL(5200, t.nonDealerWinByDiscard(4, 20));
	CHECK_EQUAL(7700, t.nonDealerWinByDiscard(4, 30));
}